

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaCompressDXT.cpp
# Opt level: O0

void __thiscall nv::CudaCompressor::~CudaCompressor(CudaCompressor *this)

{
  CudaCompressor *this_local;
  
  return;
}

Assistant:

CudaCompressor::~CudaCompressor()
{
#if defined HAVE_CUDA
	// Free device mem allocations.
	cudaFree(m_data);
	cudaFree(m_result);
	cudaFree(m_bitmapTable);
#endif
}